

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertExceptionCommand
          (CommandRunner *this,AssertExceptionCommand *command)

{
  pointer pcVar1;
  int iVar2;
  char *format;
  Enum EVar3;
  ActionResult result;
  ActionResult local_98;
  long *local_50 [2];
  long local_40 [2];
  
  RunAction(&local_98,this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,
            &command->action,Quiet);
  if (local_98.trap.obj_ == (Trap *)0x0) {
    EVar3 = Error;
    format = "expected an exception to be thrown";
  }
  else {
    pcVar1 = ((local_98.trap.obj_)->message_)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + ((local_98.trap.obj_)->message_)._M_string_length)
    ;
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    EVar3 = (Enum)(iVar2 != 0);
    format = "assert_exception passed";
    if (iVar2 != 0) {
      format = "expected an exception to be thrown";
    }
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,format);
  if (local_98.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.trap.store_,local_98.trap.root_index_);
    local_98.trap.obj_ = (Trap *)0x0;
    local_98.trap.store_ = (Store *)0x0;
    local_98.trap.root_index_ = 0;
  }
  if (local_98.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertExceptionCommand(
    const AssertExceptionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "uncaught exception") {
    PrintError(command->line, "expected an exception to be thrown");
    return wabt::Result::Error;
  }
  PrintError(command->line, "assert_exception passed");

  return wabt::Result::Ok;
}